

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGValidatePopElement(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  int iVar1;
  xmlRegExecCtxtPtr pxVar2;
  uint uVar3;
  xmlRegExecCtxtPtr exec;
  
  uVar3 = 0xffffffff;
  if (((ctxt != (xmlRelaxNGValidCtxtPtr)0x0) && (elem != (xmlNodePtr)0x0)) &&
     (ctxt->elem != (xmlRegExecCtxtPtr)0x0)) {
    iVar1 = ctxt->elemNr;
    if (iVar1 < 1) {
      exec = (xmlRegExecCtxtPtr)0x0;
    }
    else {
      uVar3 = iVar1 - 1;
      ctxt->elemNr = uVar3;
      exec = ctxt->elemTab[uVar3];
      ctxt->elemTab[uVar3] = (xmlRegExecCtxtPtr)0x0;
      if (iVar1 == 1) {
        pxVar2 = (xmlRegExecCtxtPtr)0x0;
      }
      else {
        pxVar2 = ctxt->elemTab[(ulong)uVar3 - 1];
      }
      ctxt->elem = pxVar2;
    }
    iVar1 = xmlRegExecPushString(exec,(xmlChar *)0x0,(void *)0x0);
    if (iVar1 == 0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOELEM,"",(xmlChar *)0x0,0);
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = iVar1 >> 0x1f | 1;
    }
    xmlRegFreeExecCtxt(exec);
  }
  return uVar3;
}

Assistant:

int
xmlRelaxNGValidatePopElement(xmlRelaxNGValidCtxtPtr ctxt,
                             xmlDocPtr doc ATTRIBUTE_UNUSED,
                             xmlNodePtr elem)
{
    int ret;
    xmlRegExecCtxtPtr exec;

    if ((ctxt == NULL) || (ctxt->elem == NULL) || (elem == NULL))
        return (-1);
#ifdef DEBUG_PROGRESSIVE
    xmlGenericError(xmlGenericErrorContext, "PopElem %s\n", elem->name);
#endif
    /*
     * verify that we reached a terminal state of the content model.
     */
    exec = xmlRelaxNGElemPop(ctxt);
    ret = xmlRegExecPushString(exec, NULL, NULL);
    if (ret == 0) {
        /*
         * TODO: get some of the names needed to exit the current state of exec
         */
        VALID_ERR2(XML_RELAXNG_ERR_NOELEM, BAD_CAST "");
        ret = -1;
    } else if (ret < 0) {
        ret = -1;
    } else {
        ret = 1;
    }
    xmlRegFreeExecCtxt(exec);
#ifdef DEBUG_PROGRESSIVE
    if (ret < 0)
        xmlGenericError(xmlGenericErrorContext, "PopElem %s failed\n",
                        elem->name);
#endif
    return (ret);
}